

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall ddd::DaTrie<true,_true,_false>::push_block_(DaTrie<true,_true,_false> *this)

{
  pointer *ppBVar1;
  pointer *ppNVar2;
  pointer *ppBVar3;
  ulong uVar4;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  pointer pBVar5;
  ulong uVar6;
  int iVar7;
  uint32_t block_pos;
  ulong uVar8;
  BlockLink local_40;
  
  uVar8 = (ulong)((long)(this->blocks_).
                        super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->blocks_).
                       super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 4;
  iVar7 = 0x100;
  do {
    local_40.next = 0;
    local_40.prev = 0;
    __position._M_current =
         (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::_M_realloc_insert<ddd::Bc>
                (&this->bc_,__position,(Bc *)&local_40);
    }
    else {
      *__position._M_current = (Bc)0x0;
      ppBVar1 = &(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  iVar7 = 0x100;
  do {
    local_40._0_8_ = local_40._0_8_ & 0xffffffffffff0000;
    __position_00._M_current =
         (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::_M_realloc_insert<ddd::NodeLink>
                (&this->node_links_,__position_00,(NodeLink *)&local_40);
    }
    else {
      (__position_00._M_current)->child = '\0';
      (__position_00._M_current)->sib = '\0';
      ppNVar2 = &(this->node_links_).
                 super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppNVar2 = *ppNVar2 + 1;
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  local_40.head = 0;
  local_40.num_emps = 0x100;
  local_40.next = 0;
  local_40.prev = 0;
  __position_01._M_current =
       (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::_M_realloc_insert<ddd::BlockLink>
              (&this->blocks_,__position_01,&local_40);
  }
  else {
    (__position_01._M_current)->next = 0;
    (__position_01._M_current)->prev = 0;
    (__position_01._M_current)->head = 0;
    (__position_01._M_current)->num_emps = 0x100;
    ppBVar3 = &(this->blocks_).super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppBVar3 = *ppBVar3 + 1;
  }
  block_pos = (uint32_t)uVar8;
  if (block_pos * 0x100 != -0x100) {
    uVar6 = (uVar8 << 0x28) + 0x7fffffff00000000;
    uVar8 = (ulong)(block_pos << 8);
    do {
      uVar4 = uVar8 + 1;
      *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start + uVar8) = (uint)uVar4 & 0x7fffffff;
      pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar5[uVar8] = (Bc)((ulong)pBVar5[uVar8] & 0x80000000ffffffff | uVar6 & 0x7fffffff00000000);
      uVar6 = uVar6 + 0x100000000;
      uVar8 = uVar4;
    } while (uVar4 < block_pos * 0x100 + 0x100);
  }
  push_block_(this,block_pos,&this->blocks_);
  this->bc_emps_ = this->bc_emps_ + 0x100;
  return;
}

Assistant:

void push_block_() {
    auto block_pos = num_blocks();

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.push_back(Bc{});
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.push_back(NodeLink{});
      }
    }
    blocks_.push_back(BlockType{});

    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto i = begin; i < end; ++i) {
      set_next_(i, i + 1);
      set_prev_(i, i - 1);
    }

    push_block_(block_pos, blocks_);
    bc_emps_ += BLOCK_SIZE;
  }